

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaMuxes.c
# Opt level: O0

void Gia_ManProfilePrintOne(Gia_Man_t *p,int i,Vec_Int_t *vArray)

{
  int iVar1;
  int iVar2;
  Gia_Obj_t *pObj_00;
  int local_40;
  int local_3c;
  uint local_38;
  int Prev;
  int Count;
  int nFanouts;
  int nFanins;
  int k;
  Gia_Obj_t *pObj;
  Vec_Int_t *vArray_local;
  int i_local;
  Gia_Man_t *p_local;
  
  pObj_00 = Gia_ManObj(p,i);
  iVar1 = Gia_ObjIsRi(p,pObj_00);
  if (iVar1 == 0) {
    iVar1 = Gia_ObjIsRo(p,pObj_00);
    if (iVar1 == 0) {
      local_40 = Gia_ObjFaninNum(p,pObj_00);
    }
    else {
      local_40 = 1;
    }
    iVar1 = Gia_ObjFanoutNum(p,pObj_00);
    printf("%6d : ");
    for (nFanouts = 0; nFanouts < local_40; nFanouts = nFanouts + 1) {
      Vec_IntEntry(vArray,nFanouts + 1);
      printf("  %5s");
    }
    for (; nFanouts < 3; nFanouts = nFanouts + 1) {
      printf("  %5s");
    }
    printf("  ->");
    iVar2 = Vec_IntEntry(vArray,0);
    printf(" %5s",GIA_TYPE_STRINGS[iVar2]);
    printf("  ->");
    if (0 < iVar1) {
      local_38 = 1;
      local_3c = Vec_IntEntry(vArray,local_40 + 1);
      for (nFanouts = 1; nFanouts < iVar1; nFanouts = nFanouts + 1) {
        iVar2 = Vec_IntEntry(vArray,nFanouts + 1 + local_40);
        if (local_3c != iVar2) {
          printf("  %d x %s",(ulong)local_38,GIA_TYPE_STRINGS[local_3c]);
          local_3c = Vec_IntEntry(vArray,nFanouts + 1 + local_40);
          local_38 = 0;
        }
        local_38 = local_38 + 1;
      }
      printf("  %d x %s",(ulong)local_38,GIA_TYPE_STRINGS[local_3c]);
    }
    printf("\n");
  }
  return;
}

Assistant:

void Gia_ManProfilePrintOne( Gia_Man_t * p, int i, Vec_Int_t * vArray )
{
    Gia_Obj_t * pObj = Gia_ManObj( p, i );
    int k, nFanins, nFanouts;
    if ( Gia_ObjIsRi(p, pObj) )
        return;
    nFanins = Gia_ObjIsRo(p, pObj) ? 1 : Gia_ObjFaninNum(p, pObj);
    nFanouts = Gia_ObjFanoutNum(p, pObj);

    printf( "%6d : ", i );
    for ( k = 0; k < nFanins; k++ )
        printf( "  %5s", GIA_TYPE_STRINGS[Vec_IntEntry(vArray, k + 1)] );
    for (      ; k < 3; k++ )
        printf( "  %5s", "" );
    printf( "  ->" );
    printf( " %5s", GIA_TYPE_STRINGS[Vec_IntEntry(vArray, 0)] );
    printf( "  ->" );
    if ( nFanouts > 0 )
    {
        int Count = 1, Prev = Vec_IntEntry(vArray, 1 + nFanins);
        for ( k = 1; k < nFanouts; k++ )
        {
            if ( Prev != Vec_IntEntry(vArray, k + 1 + nFanins) )
            {
                printf( "  %d x %s", Count, GIA_TYPE_STRINGS[Prev] );
                Prev = Vec_IntEntry(vArray, k + 1 + nFanins);
                Count = 0;
            }
            Count++;
        }
        printf( "  %d x %s", Count, GIA_TYPE_STRINGS[Prev] );
    }
    printf( "\n" );
}